

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

bool __thiscall Liby::http::RequestParser::ParseURI(RequestParser *this,char *begin,char *end)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  ulong uVar4;
  
  if (((end == (char *)0x0) || (begin == (char *)0x0)) || (end < begin)) {
    __assert_fail("begin <= end && begin && end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                  ,0xd2,"bool Liby::http::RequestParser::ParseURI(const char *, const char *)");
  }
  iVar9 = (int)end - (int)begin;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)(iVar9 + 1)) {
    uVar4 = (long)(iVar9 + 1);
  }
  __s = (char *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
  if (__s != (char *)0x0) {
    uVar6 = 0;
    uVar4 = 0xffffffff;
    iVar3 = -1;
    if (0 < iVar9) {
      uVar5 = 0;
      do {
        iVar7 = (int)uVar6;
        if (begin[iVar7] == '%') {
          bVar1 = begin[(long)iVar7 + 2] - 0x30;
          bVar8 = (begin[(long)iVar7 + 2] | 0x20U) + 0xa9;
          if (bVar1 < 10) {
            bVar8 = bVar1;
          }
          __s[uVar5] = ((9 < (byte)(begin[(long)iVar7 + 1] - 0x30U)) * '\t' + begin[(long)iVar7 + 1]
                       ) * '\x10' + bVar8;
          iVar7 = iVar7 + 2;
        }
        else {
          __s[uVar5] = begin[iVar7];
        }
        if (__s[uVar5] == '?') {
          __s[uVar5] = '\0';
          uVar4 = uVar5 & 0xffffffff;
        }
        iVar3 = (int)uVar4;
        uVar6 = (ulong)(iVar7 + 1U);
        uVar5 = uVar5 + 1;
      } while ((int)(iVar7 + 1U) < iVar9);
      uVar6 = uVar5 & 0xffffffff;
    }
    __s[uVar6] = '\0';
    if (iVar3 != -1) {
      pcVar2 = (char *)(this->super_Request).query_._M_string_length;
      strlen(__s + (long)iVar3 + 1);
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_Request).query_,0,pcVar2,(ulong)(__s + (long)iVar3 + 1));
    }
    pcVar2 = (char *)(this->super_Request).uri_._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&(this->super_Request).uri_,0,pcVar2,(ulong)__s);
    this->progress_ = 3;
    if (__s != (char *)0x0) goto LAB_0011ad95;
  }
  this->progress_ = 7;
LAB_0011ad95:
  return __s != (char *)0x0;
}

Assistant:

bool RequestParser::ParseURI(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    do {
        int query_index = -1;
        int n = end - begin;
        const char *src = begin;
        char *temp = new (std::nothrow) char[n + 1];
        if (temp == nullptr)
            break;
        int i = 0, j = 0;
        for (; i < n; i++, j++) {
            if (src[i] == '%') {
                temp[j] = parse_hex(src + i + 1);
                i += 2;
            } else {
                temp[j] = src[i];
            }
            if (temp[j] == '?') {
                query_index = j;
                temp[j] = '\0';
            }
        }
        temp[j] = '\0';

        if (query_index != -1)
            query_ = &temp[query_index + 1];
        uri_ = temp;
        progress_ = ParsingVersion;
        return true;
    } while (0);

    progress_ = InvalidURI;
    return false;
}